

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cpp
# Opt level: O1

void __thiscall Clasp::Solver::Dirty::cleanup(Dirty *this,EVP_PKEY_CTX *ctx)

{
  buf_type *pbVar1;
  long *plVar2;
  Constraint *c;
  Dirty *pDVar3;
  bool bVar4;
  long lVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  long *in_RDX;
  long *plVar9;
  uint uVar10;
  undefined8 *puVar11;
  EVP_PKEY_CTX *pEVar12;
  undefined8 *puVar13;
  undefined8 *puVar14;
  EVP_PKEY_CTX *pEVar15;
  uint *puVar16;
  uint uVar17;
  GenericWatch *__tmp;
  undefined8 *puVar18;
  uint *puVar19;
  InSet local_78;
  InSet local_70;
  long *local_68;
  undefined8 *local_60;
  uint *local_58;
  EVP_PKEY_CTX *local_50;
  Dirty *local_48;
  _Hashtable<Clasp::Constraint_*,_Clasp::Constraint_*,_std::allocator<Clasp::Constraint_*>,_std::__detail::_Identity,_std::equal_to<Clasp::Constraint_*>,_std::hash<Clasp::Constraint_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  *local_40;
  long *local_38;
  
  local_40 = &(this->cons)._M_h;
  uVar7 = (ulong)(this->dirty).super_type.super_left_right_rep<Clasp::Literal,_unsigned_int>.left_;
  local_48 = this;
  local_38 = in_RDX;
  if (uVar7 != 0) {
    uVar17 = *(uint *)(ctx + 8);
    puVar19 = (uint *)(this->dirty).super_type.super_left_right_rep<Clasp::Literal,_unsigned_int>.
                      buf_;
    puVar16 = (uint *)(uVar7 + (long)puVar19);
    local_60 = (undefined8 *)CONCAT44(local_60._4_4_,uVar17);
    local_58 = puVar16;
    local_50 = ctx;
    do {
      if (*puVar19 >> 1 < uVar17) {
        plVar9 = (long *)(*(long *)ctx + (ulong)(*puVar19 >> 1) * 0x18);
        uVar10 = *(uint *)((long)plVar9 + 0xc);
        if (7 < (ulong)uVar10) {
          uVar7 = *(ulong *)*plVar9;
          if (((uVar7 & 1) != 0) &&
             (uVar7 = uVar7 & 0xfffffffffffffffe, *(ulong *)*plVar9 = uVar7, uVar7 != 0)) {
            puVar18 = (undefined8 *)*plVar9;
            puVar14 = (undefined8 *)((long)puVar18 + (ulong)uVar10);
            local_70.set = (ConstraintSet *)local_40;
            local_78.set = (ConstraintSet *)local_40;
            local_68 = plVar9;
            if (0x1f < uVar10) {
              puVar13 = (undefined8 *)((ulong)(uVar10 & 0xffffffe0) + (long)puVar18);
              lVar5 = (ulong)(uVar10 >> 5) + 1;
              puVar11 = puVar18 + 2;
              do {
                bVar4 = anon_unknown_26::InSet::operator()(&local_78,(Constraint *)puVar11[-2]);
                if (bVar4) {
                  puVar11 = puVar11 + -2;
                  goto LAB_0016e7b9;
                }
                bVar4 = anon_unknown_26::InSet::operator()(&local_78,(Constraint *)puVar11[-1]);
                if (bVar4) {
                  puVar11 = puVar11 + -1;
                  goto LAB_0016e7b9;
                }
                bVar4 = anon_unknown_26::InSet::operator()(&local_78,(Constraint *)*puVar11);
                if (bVar4) goto LAB_0016e7b9;
                bVar4 = anon_unknown_26::InSet::operator()(&local_78,(Constraint *)puVar11[1]);
                if (bVar4) {
                  puVar11 = puVar11 + 1;
                  goto LAB_0016e7b9;
                }
                lVar5 = lVar5 + -1;
                puVar11 = puVar11 + 4;
                puVar18 = puVar13;
              } while (1 < lVar5);
            }
            lVar5 = (long)puVar14 - (long)puVar18 >> 3;
            if (lVar5 == 1) {
LAB_0016e719:
              bVar4 = anon_unknown_26::InSet::operator()(&local_78,(Constraint *)*puVar18);
              puVar11 = puVar18;
              if (!bVar4) {
                puVar11 = puVar14;
              }
            }
            else if (lVar5 == 2) {
LAB_0016e702:
              bVar4 = anon_unknown_26::InSet::operator()(&local_78,(Constraint *)*puVar18);
              puVar11 = puVar18;
              if (!bVar4) {
                puVar18 = puVar18 + 1;
                goto LAB_0016e719;
              }
            }
            else {
              puVar11 = puVar14;
              if ((lVar5 == 3) &&
                 (bVar4 = anon_unknown_26::InSet::operator()(&local_78,(Constraint *)*puVar18),
                 puVar11 = puVar18, !bVar4)) {
                puVar18 = puVar18 + 1;
                goto LAB_0016e702;
              }
            }
LAB_0016e7b9:
            puVar18 = puVar11 + 1;
            if (puVar18 != puVar14 && puVar11 != puVar14) {
              do {
                bVar4 = anon_unknown_26::InSet::operator()(&local_70,(Constraint *)*puVar18);
                if (!bVar4) {
                  *puVar11 = *puVar18;
                  puVar11 = puVar11 + 1;
                }
                puVar18 = puVar18 + 1;
              } while (puVar18 != puVar14);
            }
            *(int *)((long)local_68 + 0xc) = (int)puVar11 - (int)*local_68;
            ctx = local_50;
            puVar16 = local_58;
            plVar9 = local_68;
            uVar17 = (uint)local_60;
          }
        }
        uVar10 = *(uint *)(plVar9 + 2);
        uVar6 = *(uint *)(plVar9 + 1) & 0x7fffffff;
        if (0xf < uVar6 - uVar10) {
          uVar7 = *(ulong *)(*plVar9 + -0x10 + (ulong)uVar6);
          if (((uVar7 & 1) != 0) &&
             (uVar7 = uVar7 & 0xfffffffffffffffe, *(ulong *)(*plVar9 + -0x10 + (ulong)uVar6) = uVar7
             , uVar7 != 0)) {
            puVar14 = (undefined8 *)(*plVar9 + (ulong)(*(uint *)(plVar9 + 1) & 0x7fffffff));
            puVar11 = (undefined8 *)(*plVar9 + (ulong)uVar10);
            local_70.set = (ConstraintSet *)local_40;
            local_78.set = (ConstraintSet *)local_40;
            lVar5 = (long)((ulong)(*(uint *)(plVar9 + 1) & 0x7fffffff) - (ulong)uVar10) >> 6;
            puVar18 = puVar14;
            local_68 = plVar9;
            if (0 < lVar5) {
              puVar18 = puVar14 + lVar5 * -8;
              lVar5 = lVar5 + 1;
              do {
                bVar4 = anon_unknown_26::InSet::operator()(&local_78,(Constraint *)puVar14[-2]);
                if (bVar4) goto LAB_0016e960;
                bVar4 = anon_unknown_26::InSet::operator()(&local_78,(Constraint *)puVar14[-4]);
                if (bVar4) {
                  puVar14 = puVar14 + -2;
                  goto LAB_0016e960;
                }
                bVar4 = anon_unknown_26::InSet::operator()(&local_78,(Constraint *)puVar14[-6]);
                if (bVar4) {
                  puVar14 = puVar14 + -4;
                  goto LAB_0016e960;
                }
                bVar4 = anon_unknown_26::InSet::operator()(&local_78,(Constraint *)puVar14[-8]);
                if (bVar4) {
                  puVar14 = puVar14 + -6;
                  goto LAB_0016e960;
                }
                puVar14 = puVar14 + -8;
                lVar5 = lVar5 + -1;
              } while (1 < lVar5);
            }
            lVar5 = (long)puVar18 - (long)puVar11 >> 4;
            if (lVar5 == 1) {
LAB_0016e9d1:
              bVar4 = anon_unknown_26::InSet::operator()(&local_78,(Constraint *)puVar18[-2]);
              puVar14 = puVar18;
              if (!bVar4) {
                puVar14 = puVar11;
              }
            }
            else {
              puVar14 = puVar18;
              if (lVar5 == 2) {
LAB_0016e932:
                bVar4 = anon_unknown_26::InSet::operator()(&local_78,(Constraint *)puVar14[-2]);
                if (!bVar4) {
                  puVar18 = puVar14 + -2;
                  goto LAB_0016e9d1;
                }
              }
              else {
                puVar14 = puVar11;
                if ((lVar5 == 3) &&
                   (bVar4 = anon_unknown_26::InSet::operator()(&local_78,(Constraint *)puVar18[-2]),
                   puVar14 = puVar18, !bVar4)) {
                  puVar14 = puVar18 + -2;
                  goto LAB_0016e932;
                }
              }
            }
LAB_0016e960:
            puVar18 = puVar14 + -2;
            if (puVar14 + -2 != puVar11 && puVar14 != puVar11) {
              do {
                puVar13 = puVar18 + -2;
                bVar4 = anon_unknown_26::InSet::operator()(&local_70,(Constraint *)puVar18[-2]);
                if (!bVar4) {
                  *(undefined4 *)(puVar14 + -1) = *(undefined4 *)(puVar18 + -1);
                  puVar14[-2] = *puVar13;
                  puVar14 = puVar14 + -2;
                }
                puVar18 = puVar13;
              } while (puVar13 != puVar11);
            }
            *(int *)(local_68 + 2) = (int)puVar14 - (int)*local_68;
            ctx = local_50;
            puVar16 = local_58;
            uVar17 = (uint)local_60;
          }
        }
      }
      puVar19 = puVar19 + 1;
    } while (puVar19 != puVar16);
  }
  uVar10 = *(uint *)&(local_48->dirty).super_type.super_left_right_rep<Clasp::Literal,_unsigned_int>
                     .field_0x8 & 0x7fffffff;
  uVar17 = (local_48->dirty).super_type.super_left_right_rep<Clasp::Literal,_unsigned_int>.right_;
  if (uVar10 != uVar17) {
    pbVar1 = (local_48->dirty).super_type.super_left_right_rep<Clasp::Literal,_unsigned_int>.buf_;
    pEVar15 = (EVP_PKEY_CTX *)(pbVar1 + uVar17);
    pEVar12 = (EVP_PKEY_CTX *)(pbVar1 + uVar10);
    uVar17 = *(uint *)(local_38 + 1);
    local_58 = (uint *)CONCAT44(local_58._4_4_,uVar17);
    plVar9 = local_38;
    local_50 = pEVar15;
    do {
      if (*(uint *)(pEVar12 + -4) < uVar17) {
        plVar2 = *(long **)(*plVar9 + 8 + (ulong)*(uint *)(pEVar12 + -4) * 0x10);
        uVar10 = *(uint *)(plVar2 + 1);
        uVar7 = (ulong)uVar10;
        if (uVar7 != 0) {
          uVar8 = *(ulong *)*plVar2;
          if (((uVar8 & 1) != 0) &&
             (uVar8 = uVar8 & 0xfffffffffffffffe, *(ulong *)*plVar2 = uVar8, uVar8 != 0)) {
            puVar14 = (undefined8 *)*plVar2;
            puVar18 = puVar14 + uVar7;
            local_70.set = (ConstraintSet *)local_40;
            local_78.set = (ConstraintSet *)local_40;
            local_68 = plVar2;
            if (3 < uVar10) {
              local_60 = puVar14 + (uVar10 & 0xfffffffc);
              lVar5 = (ulong)(uVar10 >> 2) + 1;
              puVar11 = puVar14 + 2;
              do {
                bVar4 = anon_unknown_26::InSet::operator()(&local_78,(Constraint *)puVar11[-2]);
                if (bVar4) {
                  puVar11 = puVar11 + -2;
                  goto LAB_0016eb8f;
                }
                bVar4 = anon_unknown_26::InSet::operator()(&local_78,(Constraint *)puVar11[-1]);
                if (bVar4) {
                  puVar11 = puVar11 + -1;
                  goto LAB_0016eb8f;
                }
                bVar4 = anon_unknown_26::InSet::operator()(&local_78,(Constraint *)*puVar11);
                if (bVar4) goto LAB_0016eb8f;
                bVar4 = anon_unknown_26::InSet::operator()(&local_78,(Constraint *)puVar11[1]);
                if (bVar4) {
                  puVar11 = puVar11 + 1;
                  goto LAB_0016eb8f;
                }
                lVar5 = lVar5 + -1;
                puVar11 = puVar11 + 4;
                puVar14 = local_60;
              } while (1 < lVar5);
            }
            lVar5 = (long)puVar18 - (long)puVar14 >> 3;
            if (lVar5 == 1) {
LAB_0016eb67:
              bVar4 = anon_unknown_26::InSet::operator()(&local_78,(Constraint *)*puVar14);
              puVar11 = puVar14;
              if (!bVar4) {
                puVar11 = puVar18;
              }
            }
            else if (lVar5 == 2) {
LAB_0016eac7:
              bVar4 = anon_unknown_26::InSet::operator()(&local_78,(Constraint *)*puVar14);
              puVar11 = puVar14;
              if (!bVar4) {
                puVar14 = puVar14 + 1;
                goto LAB_0016eb67;
              }
            }
            else {
              puVar11 = puVar18;
              if ((lVar5 == 3) &&
                 (bVar4 = anon_unknown_26::InSet::operator()(&local_78,(Constraint *)*puVar14),
                 puVar11 = puVar14, !bVar4)) {
                puVar14 = puVar14 + 1;
                goto LAB_0016eac7;
              }
            }
LAB_0016eb8f:
            puVar14 = puVar11 + 1;
            if (puVar14 != puVar18 && puVar11 != puVar18) {
              do {
                c = (Constraint *)*puVar14;
                bVar4 = anon_unknown_26::InSet::operator()(&local_70,c);
                if (!bVar4) {
                  *puVar11 = c;
                  puVar11 = puVar11 + 1;
                }
                puVar14 = puVar14 + 1;
              } while (puVar14 != puVar18);
            }
            *(uint *)(local_68 + 1) = uVar10 - (int)((uVar7 * 8 + *local_68) - (long)puVar11 >> 3);
            plVar9 = local_38;
            pEVar15 = local_50;
            uVar17 = (uint)local_58;
          }
        }
      }
      pEVar12 = pEVar12 + -4;
    } while (pEVar12 != pEVar15);
  }
  pDVar3 = local_48;
  (local_48->dirty).super_type.super_left_right_rep<Clasp::Literal,_unsigned_int>.left_ = 0;
  (local_48->dirty).super_type.super_left_right_rep<Clasp::Literal,_unsigned_int>.right_ =
       *(uint *)&(local_48->dirty).super_type.super_left_right_rep<Clasp::Literal,_unsigned_int>.
                 field_0x8 & 0x7fffffff;
  std::
  _Hashtable<Clasp::Constraint_*,_Clasp::Constraint_*,_std::allocator<Clasp::Constraint_*>,_std::__detail::_Identity,_std::equal_to<Clasp::Constraint_*>,_std::hash<Clasp::Constraint_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::clear(local_40);
  pDVar3->last = (Constraint *)0x0;
  return;
}

Assistant:

void cleanup(Watches& watches, DecisionLevels& levels) {
		InSet inCons = { &cons };
		const uint32 maxId = (uint32)watches.size();
		for (DirtyList::left_iterator it = dirty.left_begin(), end = dirty.left_end(); it != end; ++it) {
			uint32 id = it->id();
			if (id >= maxId)
				continue;
			WatchList& wl = watches[id];
			if (wl.left_size() && test_and_clear(wl.left_begin()->head)) { wl.shrink_left(std::remove_if(wl.left_begin(), wl.left_end(), inCons)); }
			if (wl.right_size()&& test_and_clear(wl.right_begin()->con)) { wl.shrink_right(std::remove_if(wl.right_begin(), wl.right_end(), inCons)); }
		}
		ConstraintDB* db = 0;
		for (DirtyList::right_iterator it = dirty.right_begin(), end = dirty.right_end(); it != end; ++it) {
			if (*it < levels.size() && !(db = levels[*it].undo)->empty() && test_and_clear(*db->begin())) {
				db->erase(std::remove_if(db->begin(), db->end(), inCons), db->end());
			}
		}
		dirty.clear();
		cons.clear();
		last = 0;
	}